

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall pstore::database::finish_init(database *this,bool access_tick_enabled)

{
  storage *addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint128 val;
  int iVar1;
  base32 *this_01;
  ulong uVar2;
  string name;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> in_stack_ffffffffffffffc8;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var3;
  bool in_stack_ffffffffffffffd0;
  bool bVar4;
  undefined7 in_stack_ffffffffffffffd1;
  undefined7 uVar5;
  undefined8 local_28;
  
  iVar1 = (*((this->storage_).file_.
             super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_file_base[2])();
  if ((char)iVar1 != '\0') {
    addr = &this->storage_;
    storage::update_master_pointers(addr,0);
    trailer::validate(this,(typed_address<pstore::trailer>)(this->size_).footer_pos_.a_.a_);
    storage::protect(addr,(address)0x30,(address)(this->size_).logical_);
    storage::address_to_pointer<pstore::header>
              ((storage *)&stack0xffffffffffffffc8,(typed_address<pstore::header>)addr);
    _Var3._M_head_impl = (array<pstore::sat_entry,_65536UL> *)0x0;
    bVar4 = false;
    uVar5 = 0;
    this_00 = (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)in_stack_ffffffffffffffc8._M_head_impl;
    (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uVar5,bVar4) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uVar5,bVar4));
      }
    }
    this_01 = (base32 *)
              uint128::bytes_to_uint128
                        ((uint8_t *)
                         &(((this->header_).
                            super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          a).id);
    val.v_._8_1_ = bVar4;
    val.v_._0_8_ = (pointer)_Var3._M_head_impl;
    val.v_._9_7_ = uVar5;
    base32::convert<pstore::uint128>((string *)&stack0xffffffffffffffc8,this_01,val);
    uVar2 = 0x14;
    if (CONCAT71(uVar5,bVar4) < 0x14) {
      uVar2 = CONCAT71(uVar5,bVar4);
    }
    *(undefined1 *)
     ((long)&(_Var3._M_head_impl)->_M_elems[0].value.
             super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr + uVar2) = 0;
    std::__cxx11::string::operator=((string *)&this->sync_name_,(string *)&stack0xffffffffffffffc8);
    if (_Var3._M_head_impl != (array<pstore::sat_entry,_65536UL> *)&stack0xffffffffffffffd8) {
      operator_delete(_Var3._M_head_impl,(ulong)(local_28 + 1));
    }
    pstore::file::range_lock::range_lock
              ((range_lock *)&stack0xffffffffffffffc8,
               (this->storage_).file_.
               super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x30,8
               ,shared_read);
    pstore::file::range_lock::operator=(&this->range_lock_,(range_lock *)&stack0xffffffffffffffc8);
    pstore::file::range_lock::~range_lock((range_lock *)&stack0xffffffffffffffc8);
    std::unique_lock<pstore::file::range_lock>::lock
              ((unique_lock<pstore::file::range_lock> *)&stack0xffffffffffffffc8);
    std::unique_lock<pstore::file::range_lock>::operator=
              (&this->lock_,(unique_lock<pstore::file::range_lock> *)&stack0xffffffffffffffc8);
    std::unique_lock<pstore::file::range_lock>::~unique_lock
              ((unique_lock<pstore::file::range_lock> *)&stack0xffffffffffffffc8);
    return;
  }
  assert_failed("file ()->is_open ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0x46);
}

Assistant:

void database::finish_init (bool const access_tick_enabled) {
        (void) access_tick_enabled;

        PSTORE_ASSERT (file ()->is_open ());

        // Build the initial segment address table.
        storage_.update_master_pointers (0);

        trailer::validate (*this, size_.footer_pos ());
        this->protect (address{sizeof (header)}, address{size_.logical_size ()});

        header_ = storage_.address_to_pointer (typed_address<header>::null ());
        sync_name_ = database::build_sync_name (*header_);

        // Put a shared-read lock on the lock_block strcut in the file. We're not going to modify
        // these bytes.
        range_lock_ =
            get_vacuum_range_lock (this->file (), file::file_handle::lock_kind::shared_read);
        lock_ = std::unique_lock<file::range_lock> (range_lock_);
    }